

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nginx.c
# Opt level: O0

char * ngx_set_env(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  ulong *puVar2;
  ulong local_48;
  ngx_uint_t i;
  ngx_str_t *var;
  ngx_str_t *value;
  ngx_core_conf_t *ccf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  puVar2 = (ulong *)ngx_array_push((ngx_array_t *)((long)conf + 0xb0));
  if (puVar2 == (ulong *)0x0) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    pvVar1 = cf->args->elts;
    *puVar2 = *(ulong *)((long)pvVar1 + 0x10);
    puVar2[1] = *(ulong *)((long)pvVar1 + 0x18);
    for (local_48 = 0; local_48 < *(ulong *)((long)pvVar1 + 0x10); local_48 = local_48 + 1) {
      if (*(char *)(*(long *)((long)pvVar1 + 0x18) + local_48) == '=') {
        *puVar2 = local_48;
        return (char *)0x0;
      }
    }
    cf_local = (ngx_conf_t *)0x0;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_set_env(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_core_conf_t  *ccf = conf;

    ngx_str_t   *value, *var;
    ngx_uint_t   i;

    var = ngx_array_push(&ccf->env);
    if (var == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;
    *var = value[1];

    for (i = 0; i < value[1].len; i++) {

        if (value[1].data[i] == '=') {

            var->len = i;

            return NGX_CONF_OK;
        }
    }

    return NGX_CONF_OK;
}